

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

void __thiscall
HighsDomain::ObjectivePropagation::updateActivityLbChange
          (ObjectivePropagation *this,HighsInt col,double oldbound,double newbound)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  HighsDomain *pHVar4;
  HighsMipSolver *pHVar5;
  pointer pOVar6;
  pointer ppVar7;
  uint uVar8;
  double *pdVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  CacheMinRbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> local_50;
  vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  *local_40;
  double local_38;
  double local_30;
  
  dVar12 = this->cost[col];
  if (0.0 < dVar12) {
    pdVar9 = this->cost + col;
    dVar14 = oldbound;
    do {
      oldbound = newbound;
      newbound = dVar14;
      this->isPropagated = false;
      uVar1 = (this->objFunc->colToPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[col];
      lVar10 = (long)(int)uVar1;
      if (lVar10 != -1) {
        local_40 = &this->objectiveLowerContributions;
        pOVar6 = (this->objectiveLowerContributions).
                 super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((oldbound != 0.0) || (NAN(oldbound))) {
          ppVar7 = (this->contributionPartitionSets).
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          local_50.super_RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>.
          rootNode = &ppVar7[pOVar6[lVar10].partition].first;
          local_50.first_ = &ppVar7[pOVar6[lVar10].partition].second;
          local_38 = oldbound;
          local_30 = newbound;
          if (*local_50.first_ == uVar1) {
            dVar12 = pOVar6[lVar10].contribution;
            dVar14 = (this->objectiveLower).hi;
            dVar11 = dVar12 + dVar14;
            (this->objectiveLower).hi = dVar11;
            (this->objectiveLower).lo =
                 (dVar14 - (dVar11 - dVar12)) + (dVar12 - (dVar11 - (dVar11 - dVar12))) +
                 (this->objectiveLower).lo;
            ::highs::CacheMinRbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::
            unlink(&local_50,(char *)(ulong)uVar1);
            if ((long)*local_50.first_ != -1) {
              dVar12 = (this->objectiveLowerContributions).
                       super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
                       ._M_impl.super__Vector_impl_data._M_start[*local_50.first_].contribution;
              dVar14 = (this->objectiveLower).hi;
              dVar11 = dVar14 - dVar12;
              (this->objectiveLower).hi = dVar11;
              (this->objectiveLower).lo =
                   (dVar14 - (dVar12 + dVar11)) + (-dVar12 - (dVar11 - (dVar12 + dVar11))) +
                   (this->objectiveLower).lo;
            }
          }
          else {
            ::highs::CacheMinRbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::
            unlink(&local_50,(char *)(ulong)uVar1);
          }
          if (this->numInfObjLower != 0) {
            return;
          }
          pHVar4 = this->domain;
          dVar12 = (this->objectiveLower).hi + (this->objectiveLower).lo;
          pdVar9 = &((pHVar4->mipsolver->mipdata_)._M_t.
                     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                     .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->upper_limit;
          if (dVar12 < *pdVar9 || dVar12 == *pdVar9) {
            return;
          }
          pHVar4->infeasible_ = true;
          pHVar4->infeasible_pos =
               (HighsInt)
               ((ulong)((long)(pHVar4->domchgstack_).
                              super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pHVar4->domchgstack_).
                             super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4);
          (pHVar4->infeasible_reason).type = -7;
          (pHVar4->infeasible_reason).index = 0;
          updateActivityLbChange(this,col,local_38,local_30);
          return;
        }
        ppVar7 = (this->contributionPartitionSets).
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_50.super_RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>.rootNode
             = &ppVar7[pOVar6[lVar10].partition].first;
        local_50.first_ = &ppVar7[pOVar6[lVar10].partition].second;
        iVar2 = *local_50.first_;
        ::highs::RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::link
                  (&local_50.
                    super_RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>,
                   (char *)(ulong)uVar1,(char *)ppVar7);
        dVar12 = 0.0;
        pOVar6 = (this->objectiveLowerContributions).
                 super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((long)iVar2 != -1) {
          dVar12 = pOVar6[iVar2].contribution;
        }
        dVar14 = pOVar6[lVar10].contribution;
        if (uVar1 == *local_50.first_) {
          if ((dVar14 != dVar12) || (NAN(dVar14) || NAN(dVar12))) {
            dVar14 = (this->objectiveLower).hi;
            dVar13 = dVar12 + dVar14;
            (this->objectiveLower).hi = dVar13;
            dVar11 = pOVar6[lVar10].contribution;
            dVar15 = dVar13 - dVar11;
            (this->objectiveLower).hi = dVar15;
            (this->objectiveLower).lo =
                 (dVar13 - (dVar11 + dVar15)) + (-dVar11 - (dVar15 - (dVar11 + dVar15))) +
                 (dVar14 - (dVar13 - dVar12)) + (dVar12 - (dVar13 - (dVar13 - dVar12))) +
                 (this->objectiveLower).lo;
            if (*local_50.super_RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>
                 .rootNode == 0xffffffff) {
              uVar8 = 0xffffffff;
            }
            else {
              uVar3 = *local_50.
                       super_RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>.
                       rootNode;
              do {
                uVar8 = uVar3;
                uVar3 = (local_40->
                        super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
                        )._M_impl.super__Vector_impl_data._M_start[(int)uVar8].links.child[1];
              } while (uVar3 != 0xffffffff);
            }
            dVar12 = pOVar6[lVar10].contribution;
            if (uVar8 != uVar1) {
              dVar12 = dVar12 - pOVar6[(int)uVar8].contribution;
            }
LAB_00292861:
            dVar12 = (1.0 - ((this->domain->mipsolver->mipdata_)._M_t.
                             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                             .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                            feastol) * dVar12;
            dVar14 = this->capacityThreshold;
            if (this->capacityThreshold <= dVar12) {
              dVar14 = dVar12;
            }
            this->capacityThreshold = dVar14;
            return;
          }
        }
        dVar12 = dVar12 - dVar14;
        goto LAB_00292861;
      }
      if (-INFINITY < newbound) {
        dVar12 = dVar12 * newbound;
        dVar14 = (this->objectiveLower).hi;
        dVar11 = dVar14 - dVar12;
        (this->objectiveLower).hi = dVar11;
        (this->objectiveLower).lo =
             (dVar14 - (dVar12 + dVar11)) + (-dVar12 - (dVar11 - (dVar12 + dVar11))) +
             (this->objectiveLower).lo;
      }
      else {
        this->numInfObjLower = this->numInfObjLower + -1;
      }
      if (-INFINITY < oldbound) {
        dVar14 = *pdVar9 * oldbound;
        dVar12 = (this->objectiveLower).hi;
        dVar11 = dVar12 + dVar14;
        (this->objectiveLower).hi = dVar11;
        (this->objectiveLower).lo =
             (dVar12 - (dVar11 - dVar14)) + (dVar14 - (dVar11 - (dVar11 - dVar14))) +
             (this->objectiveLower).lo;
      }
      else {
        this->numInfObjLower = this->numInfObjLower + 1;
      }
      if (oldbound < newbound) {
        pHVar4 = this->domain;
        dVar12 = ((pHVar4->mipsolver->mipdata_)._M_t.
                  super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                  .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
        dVar14 = (pHVar4->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[col] -
                 (pHVar4->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[col];
        if ((pHVar4->mipsolver->model_->integrality_).
            super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_start[col] == kContinuous) {
          dVar11 = dVar14 * 0.3;
          dVar12 = dVar12 * 1000.0;
          if (dVar12 <= dVar11) {
            dVar12 = dVar11;
          }
        }
        dVar12 = *pdVar9 * (dVar14 - dVar12);
        if (dVar12 <= this->capacityThreshold) {
          dVar12 = this->capacityThreshold;
        }
        this->capacityThreshold = dVar12;
        return;
      }
      if (this->numInfObjLower != 0) {
        return;
      }
      pHVar4 = this->domain;
      dVar12 = (this->objectiveLower).hi + (this->objectiveLower).lo;
      pdVar9 = &((pHVar4->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->upper_limit;
      if (dVar12 < *pdVar9 || dVar12 == *pdVar9) {
        return;
      }
      pHVar4->infeasible_ = true;
      pHVar4->infeasible_pos =
           (HighsInt)
           ((ulong)((long)(pHVar4->domchgstack_).
                          super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(pHVar4->domchgstack_).
                         super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 4);
      (pHVar4->infeasible_reason).type = -7;
      (pHVar4->infeasible_reason).index = 0;
      pdVar9 = this->cost + col;
      dVar12 = *pdVar9;
      dVar14 = oldbound;
    } while (0.0 < dVar12);
  }
  if ((newbound < oldbound) && ((dVar12 != 0.0 || (NAN(dVar12))))) {
    pHVar5 = this->domain->mipsolver;
    dVar14 = ((pHVar5->mipdata_)._M_t.
              super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
              _M_t.
              super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
              .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
    dVar11 = (this->domain->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[col] - newbound;
    if ((pHVar5->model_->integrality_).
        super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
        super__Vector_impl_data._M_start[col] == kContinuous) {
      dVar13 = dVar11 * 0.3;
      dVar14 = dVar14 * 1000.0;
      if (dVar14 <= dVar13) {
        dVar14 = dVar13;
      }
    }
    dVar12 = (dVar11 - dVar14) * -dVar12;
    if (dVar12 <= this->capacityThreshold) {
      dVar12 = this->capacityThreshold;
    }
    this->capacityThreshold = dVar12;
    this->isPropagated = false;
  }
  return;
}

Assistant:

void HighsDomain::ObjectivePropagation::updateActivityLbChange(
    HighsInt col, double oldbound, double newbound) {
  if (cost[col] <= 0.0) {
    if (cost[col] != 0.0 && newbound < oldbound) {
      capacityThreshold =
          std::max(capacityThreshold,
                   -cost[col] * boundRange(domain->col_upper_[col], newbound,
                                           domain->feastol(),
                                           domain->variableType(col)));
      isPropagated = false;
    }
    debugCheckObjectiveLower();
    return;
  }

  isPropagated = false;

  HighsInt partitionPos = objFunc->getColCliquePartition(col);
  if (partitionPos == -1) {
    if (oldbound == -kHighsInf)
      --numInfObjLower;
    else
      objectiveLower -= oldbound * cost[col];

    if (newbound == -kHighsInf)
      ++numInfObjLower;
    else
      objectiveLower += newbound * cost[col];

    debugCheckObjectiveLower();

    if (newbound < oldbound) {
      capacityThreshold = std::max(
          capacityThreshold,
          cost[col] * boundRange(domain->col_upper_[col],
                                 domain->col_lower_[col], domain->feastol(),
                                 domain->variableType(col)));
    } else if (numInfObjLower == 0 &&
               objectiveLower > domain->mipsolver->mipdata_->upper_limit) {
      domain->infeasible_ = true;
      domain->infeasible_pos = domain->domchgstack_.size();
      domain->infeasible_reason = Reason::objective();
      updateActivityLbChange(col, newbound, oldbound);
    }
  } else {
    if (newbound == 0.0) {
      assert(oldbound == 1.0);
      // binary lower bound of variable in clique partition is relaxed to 0
      HighsInt partition = objectiveLowerContributions[partitionPos].partition;
      ObjectiveContributionTree contributionTree(this, partition);
      HighsInt currFirst = contributionTree.first();

      contributionTree.link(partitionPos);

      double oldContribution = 0.0;
      if (currFirst != -1)
        oldContribution = objectiveLowerContributions[currFirst].contribution;

      if (partitionPos == contributionTree.first() &&
          objectiveLowerContributions[partitionPos].contribution !=
              oldContribution) {
        objectiveLower += oldContribution;
        objectiveLower -=
            objectiveLowerContributions[partitionPos].contribution;

        // update the capacity threshold with the difference of the new highest
        // contribution position to the lowest contribution as the column with
        // the lowest contribution can be fixed to its bound that yields the
        // highest objective value.
        HighsInt bestPos = contributionTree.last();
        double delta = objectiveLowerContributions[partitionPos].contribution;
        if (bestPos != partitionPos)
          delta -= objectiveLowerContributions[bestPos].contribution;
        capacityThreshold =
            std::max(delta * (1.0 - domain->feastol()), capacityThreshold);
      } else {
        // the new linked column could be the one with the new lowest
        // contribution so update the capacity threshold to ensure propagation
        // runs when it can be fixed to the bound that yields the highest
        // objective value
        capacityThreshold =
            std::max((oldContribution -
                      objectiveLowerContributions[partitionPos].contribution) *
                         (1.0 - domain->feastol()),
                     capacityThreshold);
      }

      debugCheckObjectiveLower();
    } else {
      // binary lower bound of variable in clique partition is tightened to 1
      assert(oldbound == 0.0);
      assert(newbound == 1.0);

      HighsInt partition = objectiveLowerContributions[partitionPos].partition;
      ObjectiveContributionTree contributionTree(this, partition);
      bool wasFirst = contributionTree.first() == partitionPos;
      if (wasFirst)
        objectiveLower +=
            objectiveLowerContributions[partitionPos].contribution;

      contributionTree.unlink(partitionPos);

      if (wasFirst) {
        HighsInt newWorst = contributionTree.first();
        if (newWorst != -1)
          objectiveLower -= objectiveLowerContributions[newWorst].contribution;
      }

      debugCheckObjectiveLower();

      if (numInfObjLower == 0 &&
          objectiveLower > domain->mipsolver->mipdata_->upper_limit) {
        domain->infeasible_ = true;
        domain->infeasible_pos = domain->domchgstack_.size();
        domain->infeasible_reason = Reason::objective();
        updateActivityLbChange(col, newbound, oldbound);
      }
    }
  }
}